

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double __y;
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 auVar6 [16];
  double __x;
  undefined1 in_register_00001288 [56];
  undefined1 auVar7 [64];
  uint uVar14;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar12;
  uint uVar13;
  undefined1 in_register_000012c4 [60];
  undefined1 auVar11 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double local_28;
  
  auVar11._4_60_ = in_register_000012c4;
  auVar11._0_4_ = logarithmic_zero_epsilon;
  auVar7._8_56_ = in_register_00001288;
  auVar7._0_8_ = v_max;
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = v_min;
  auVar6 = auVar4._0_16_;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return v_min;
  }
  auVar8 = auVar7._0_16_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      return (v_max - v_min) * (double)t + v_min;
    }
    if (1.0 <= t) {
      return v_max;
    }
    auVar6 = vcmpsd_avx(auVar8,auVar6,1);
    auVar8._8_8_ = 0xbfe0000000000000;
    auVar8._0_8_ = 0xbfe0000000000000;
    auVar15._8_8_ = 0x3fe0000000000000;
    auVar15._0_8_ = 0x3fe0000000000000;
    auVar6 = vblendvpd_avx(auVar15,auVar8,auVar6);
    return (v_max - v_min) * (double)t + auVar6._0_8_ + v_min;
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  auVar18._8_8_ = 0x7fffffffffffffff;
  auVar18._0_8_ = 0x7fffffffffffffff;
  auVar15 = vandpd_avx(auVar6,auVar18);
  local_28 = (double)logarithmic_zero_epsilon;
  uVar12 = in_register_000012c4._0_4_;
  uVar13 = in_register_000012c4._4_4_;
  uVar14 = in_register_000012c4._8_4_;
  auVar17 = auVar6;
  if (auVar15._0_8_ < local_28) {
    auVar16 = auVar11._0_16_;
    if (v_min < 0.0) {
      auVar16._0_8_ = CONCAT44(uVar12,logarithmic_zero_epsilon) ^ 0x8000000080000000;
      auVar16._8_4_ = uVar13 ^ 0x80000000;
      auVar16._12_4_ = uVar14 ^ 0x80000000;
    }
    auVar17._0_8_ = (double)auVar16._0_4_;
    auVar17._8_8_ = auVar16._8_8_;
  }
  auVar15 = vandpd_avx(auVar8,auVar18);
  if (local_28 <= auVar15._0_8_) {
    auVar19._0_8_ = CONCAT44(uVar12,logarithmic_zero_epsilon) ^ 0x8000000080000000;
    auVar19._8_4_ = uVar13 ^ 0x80000000;
    auVar19._12_4_ = uVar14 ^ 0x80000000;
    auVar9 = auVar8;
  }
  else {
    auVar19._0_8_ = CONCAT44(uVar12,logarithmic_zero_epsilon) ^ 0x8000000080000000;
    auVar19._8_4_ = uVar13 ^ 0x80000000;
    auVar19._12_4_ = uVar14 ^ 0x80000000;
    auVar15 = auVar19;
    if (0.0 <= v_max) {
      auVar15 = auVar11._0_16_;
    }
    auVar9._0_8_ = (double)auVar15._0_4_;
    auVar9._8_8_ = auVar15._8_8_;
  }
  auVar15 = vcmpsd_avx(auVar8,auVar6,1);
  auVar18 = auVar17;
  if (v_min <= v_max) {
    auVar18 = auVar9;
  }
  auVar15 = vblendvpd_avx(auVar17,auVar9,auVar15);
  dVar3 = auVar15._0_8_;
  auVar10._0_8_ = (double)auVar19._0_4_;
  auVar10._8_8_ = auVar19._8_8_;
  auVar15 = vcmpsd_avx(auVar8,ZEXT816(0) << 0x40,0);
  auVar15 = vblendvpd_avx(auVar18,auVar10,auVar15);
  auVar17 = vcmpsd_avx(auVar6,ZEXT816(0) << 0x40,1);
  auVar15 = vblendvpd_avx(auVar18,auVar15,auVar17);
  dVar2 = auVar15._0_8_;
  if (v_max < v_min) {
    t = 1.0 - t;
  }
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      __x = dVar3 / dVar2;
      __y = (double)(1.0 - t);
      local_28 = dVar2;
    }
    else {
      __x = dVar2 / dVar3;
      __y = (double)t;
      local_28 = dVar3;
    }
  }
  else {
    auVar8 = vminsd_avx(auVar6,auVar8);
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(ZEXT416((uint)((float)v_max - (float)v_min)),auVar6);
    fVar5 = -(float)auVar8._0_8_ / auVar6._0_4_;
    fVar1 = fVar5 + zero_deadzone_halfsize;
    if ((fVar5 - zero_deadzone_halfsize <= t) && (t <= fVar1)) {
      return 0.0;
    }
    if (t < fVar5) {
      dVar3 = pow(-dVar3 / local_28,(double)(1.0 - t / (fVar5 - zero_deadzone_halfsize)));
      dVar3 = -dVar3;
      goto LAB_001767db;
    }
    __x = dVar2 / local_28;
    __y = (double)((t - fVar1) / (1.0 - fVar1));
  }
  dVar3 = pow(__x,__y);
LAB_001767db:
  return dVar3 * local_28;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}